

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  uint uVar1;
  long lVar2;
  secp256k1_scalar seckey_scalar;
  secp256k1_ge p;
  secp256k1_gej pj;
  secp256k1_scalar sStack_128;
  secp256k1_ge local_108;
  secp256k1_gej local_b0;
  
  pubkey->data[0x30] = '\0';
  pubkey->data[0x31] = '\0';
  pubkey->data[0x32] = '\0';
  pubkey->data[0x33] = '\0';
  pubkey->data[0x34] = '\0';
  pubkey->data[0x35] = '\0';
  pubkey->data[0x36] = '\0';
  pubkey->data[0x37] = '\0';
  pubkey->data[0x38] = '\0';
  pubkey->data[0x39] = '\0';
  pubkey->data[0x3a] = '\0';
  pubkey->data[0x3b] = '\0';
  pubkey->data[0x3c] = '\0';
  pubkey->data[0x3d] = '\0';
  pubkey->data[0x3e] = '\0';
  pubkey->data[0x3f] = '\0';
  pubkey->data[0x20] = '\0';
  pubkey->data[0x21] = '\0';
  pubkey->data[0x22] = '\0';
  pubkey->data[0x23] = '\0';
  pubkey->data[0x24] = '\0';
  pubkey->data[0x25] = '\0';
  pubkey->data[0x26] = '\0';
  pubkey->data[0x27] = '\0';
  pubkey->data[0x28] = '\0';
  pubkey->data[0x29] = '\0';
  pubkey->data[0x2a] = '\0';
  pubkey->data[0x2b] = '\0';
  pubkey->data[0x2c] = '\0';
  pubkey->data[0x2d] = '\0';
  pubkey->data[0x2e] = '\0';
  pubkey->data[0x2f] = '\0';
  pubkey->data[0x10] = '\0';
  pubkey->data[0x11] = '\0';
  pubkey->data[0x12] = '\0';
  pubkey->data[0x13] = '\0';
  pubkey->data[0x14] = '\0';
  pubkey->data[0x15] = '\0';
  pubkey->data[0x16] = '\0';
  pubkey->data[0x17] = '\0';
  pubkey->data[0x18] = '\0';
  pubkey->data[0x19] = '\0';
  pubkey->data[0x1a] = '\0';
  pubkey->data[0x1b] = '\0';
  pubkey->data[0x1c] = '\0';
  pubkey->data[0x1d] = '\0';
  pubkey->data[0x1e] = '\0';
  pubkey->data[0x1f] = '\0';
  pubkey->data[0] = '\0';
  pubkey->data[1] = '\0';
  pubkey->data[2] = '\0';
  pubkey->data[3] = '\0';
  pubkey->data[4] = '\0';
  pubkey->data[5] = '\0';
  pubkey->data[6] = '\0';
  pubkey->data[7] = '\0';
  pubkey->data[8] = '\0';
  pubkey->data[9] = '\0';
  pubkey->data[10] = '\0';
  pubkey->data[0xb] = '\0';
  pubkey->data[0xc] = '\0';
  pubkey->data[0xd] = '\0';
  pubkey->data[0xe] = '\0';
  pubkey->data[0xf] = '\0';
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)",
               (ctx->illegal_callback).data);
    uVar1 = 0;
  }
  else {
    uVar1 = secp256k1_scalar_set_b32_seckey(&sStack_128,seckey);
    secp256k1_scalar_cmov(&sStack_128,&secp256k1_scalar_one,uVar1 ^ 1);
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_b0,&sStack_128);
    secp256k1_ge_set_gej(&local_108,&local_b0);
    secp256k1_pubkey_save(pubkey,&local_108);
    for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      pubkey->data[lVar2] = pubkey->data[lVar2] & (char)(uVar1 ^ 1) - 1U;
    }
  }
  return uVar1;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_ge p;
    secp256k1_scalar seckey_scalar;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey);
    secp256k1_pubkey_save(pubkey, &p);
    memczero(pubkey, sizeof(*pubkey), !ret);

    secp256k1_scalar_clear(&seckey_scalar);
    return ret;
}